

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-type.c
# Opt level: O2

int coda_type_get_record_field_available_status(coda_type *type,long index,int *available)

{
  char *pcVar1;
  undefined8 uVar2;
  
  if (type == (coda_type *)0x0) {
    pcVar1 = "type argument is NULL (%s:%u)";
    uVar2 = 0xde1;
  }
  else {
    if (type->type_class != coda_record_class) {
      pcVar1 = coda_type_get_class_name(type->type_class);
      coda_set_error(-0x69,"type does not refer to a record (current type is %s)",pcVar1);
      return -1;
    }
    if (available != (int *)0x0) {
      if (index < 0 || (long)type[1].name <= index) {
        coda_set_error(-0x65,"field index (%ld) is not in the range [0,%ld) (%s:%u)",index,
                       type[1].name,
                       "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-type.c"
                       ,0xdf3);
        return -1;
      }
      *available = -(uint)(*(char *)(*(long *)(type[1].description + index * 8) + 0x1c) != '\0') | 1
      ;
      return 0;
    }
    pcVar1 = "available argument is NULL (%s:%u)";
    uVar2 = 0xdec;
  }
  coda_set_error(-100,pcVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-type.c"
                 ,uVar2);
  return -1;
}

Assistant:

LIBCODA_API int coda_type_get_record_field_available_status(const coda_type *type, long index, int *available)
{
    if (type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "type argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (type->type_class != coda_record_class)
    {
        coda_set_error(CODA_ERROR_INVALID_TYPE, "type does not refer to a record (current type is %s)",
                       coda_type_get_class_name(type->type_class));
        return -1;
    }
    if (available == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "available argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    if (index < 0 || index >= ((coda_type_record *)type)->num_fields)
    {
        coda_set_error(CODA_ERROR_INVALID_INDEX, "field index (%ld) is not in the range [0,%ld) (%s:%u)", index,
                       ((coda_type_record *)type)->num_fields, __FILE__, __LINE__);
        return -1;
    }
    *available = (((coda_type_record *)type)->field[index]->optional ? -1 : 1);
    return 0;
}